

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O0

sat_solver * IPdr_ManSetSolver(Pdr_Man_t *p,int k,int fSetPropOutput)

{
  int iVar1;
  sat_solver *psVar2;
  Vec_Ptr_t *p_00;
  Pdr_Set_t *pCube_00;
  int local_40;
  int local_3c;
  int j;
  int i;
  Pdr_Set_t *pCube;
  Vec_Ptr_t *vArrayK;
  sat_solver *pSat;
  int fSetPropOutput_local;
  int k_local;
  Pdr_Man_t *p_local;
  
  iVar1 = Vec_PtrSize(p->vSolvers);
  if (iVar1 != k) {
    __assert_fail("Vec_PtrSize(p->vSolvers) == k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                  ,0xdf,"sat_solver *IPdr_ManSetSolver(Pdr_Man_t *, int, int)");
  }
  iVar1 = Vec_IntSize(p->vActVars);
  if (iVar1 == k) {
    psVar2 = zsat_solver_new_seed((double)p->pPars->nRandomSeed);
    psVar2 = Pdr_ManNewSolver(psVar2,p,k,(uint)(k == 0));
    Vec_PtrPush(p->vSolvers,psVar2);
    Vec_IntPush(p->vActVars,0);
    if (fSetPropOutput != 0) {
      Pdr_ManSetPropertyOutput(p,k);
    }
    local_3c = k;
    if (k != 0) {
      for (; iVar1 = Vec_VecSize(p->vClauses), local_3c < iVar1; local_3c = local_3c + 1) {
        p_00 = Vec_VecEntry(p->vClauses,local_3c);
        for (local_40 = 0; iVar1 = Vec_PtrSize(p_00), local_40 < iVar1; local_40 = local_40 + 1) {
          pCube_00 = (Pdr_Set_t *)Vec_PtrEntry(p_00,local_40);
          Pdr_ManSolverAddClause(p,k,pCube_00);
        }
      }
    }
    return psVar2;
  }
  __assert_fail("Vec_IntSize(p->vActVars) == k",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                ,0xe0,"sat_solver *IPdr_ManSetSolver(Pdr_Man_t *, int, int)");
}

Assistant:

sat_solver * IPdr_ManSetSolver( Pdr_Man_t * p, int k, int fSetPropOutput )
{
    sat_solver * pSat;
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, j;

    assert( Vec_PtrSize(p->vSolvers) == k );
    assert( Vec_IntSize(p->vActVars) == k );

    pSat = zsat_solver_new_seed(p->pPars->nRandomSeed);
    pSat = Pdr_ManNewSolver( pSat, p, k, (int)(k == 0) );
    Vec_PtrPush( p->vSolvers, pSat );
    Vec_IntPush( p->vActVars, 0 );

    // set the property output
    if ( fSetPropOutput )
        Pdr_ManSetPropertyOutput( p, k );

    if (k == 0)
        return pSat;

    // add the clauses
    Vec_VecForEachLevelStart( p->vClauses, vArrayK, i, k )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, j )
            Pdr_ManSolverAddClause( p, k, pCube );
    return pSat;
}